

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O2

void __thiscall Fastzip::addDir(Fastzip *this,PathAlias *dirName,PackFormat format)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  string local_40;
  PackFormat local_20;
  int local_1c;
  PackFormat format_local;
  int skipLen;
  
  local_20 = format;
  std::__cxx11::string::string((string *)&local_40,(string *)dirName);
  local_1c = 0;
  if ((dirName->aliasTo)._M_string_length == 0) {
    if (this->junkPaths == true) {
      lVar1 = std::__cxx11::string::find_last_of((char *)&local_40,0x18d913);
      if (lVar1 != -1) {
        local_1c = (int)lVar1 + 1;
      }
    }
    else {
      uVar2 = (ulong)((uint)(local_40._M_dataplus._M_p[1] == ':') * 2);
      while (((byte)local_40._M_dataplus._M_p[uVar2] - 0x2e < 0x2f &&
             ((0x400000000003U >> ((ulong)((byte)local_40._M_dataplus._M_p[uVar2] - 0x2e) & 0x3f) &
              1) != 0))) {
        uVar2 = uVar2 + 1;
      }
      do {
        uVar3 = uVar2;
        if (local_40._M_dataplus._M_p + uVar3 <= local_40._M_dataplus._M_p) break;
        uVar2 = uVar3 - 1;
      } while (local_40._M_dataplus._M_p[uVar3 - 1] == '.');
      local_1c = (int)uVar3;
    }
  }
  else {
    local_1c = (int)local_40._M_string_length;
  }
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x20);
  *(int **)local_68._M_unused._0_8_ = &local_1c;
  *(PackFormat **)((long)local_68._M_unused._0_8_ + 8) = &local_20;
  *(Fastzip **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  *(PathAlias **)((long)local_68._M_unused._0_8_ + 0x18) = dirName;
  pcStack_50 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/fastzip.cpp:313:18)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/fastzip.cpp:313:18)>
             ::_M_manager;
  listFiles(&local_40,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Fastzip::addDir(const PathAlias& dirName, PackFormat format)
{
    const string& d = dirName.diskPath;

    // Set 'skipLen' to the number of chars to strip from the start of each path
    // name
    int skipLen = 0;
    if (dirName.aliasTo.length() > 0) {
        skipLen = d.length();
    } else if (junkPaths) {
        auto last = d.find_last_of("\\/");
        if (last != string::npos)
            skipLen = last + 1;
    } else {
        const char* fn = d.c_str();
        // Skip DOS drive letter
        if (fn[1] == ':')
            fn += 2;

        // Skip path prefixes such as '/' or '../../'
        while (*fn == '/' || *fn == '\\' || *fn == '.')
            fn++;
        while (fn > d.c_str() && fn[-1] == '.')
            fn--;
        skipLen = fn - d.c_str();
    }

    // Recursivly add all files to fileNames
    listFiles(d, [&](const string& path) {
        string target = path.substr(skipLen);
        PackFormat pf = format;

        if (!storeExts.empty()) {
            const char* ext = nullptr;
            auto dot = path.find_last_of('.');
            if (dot != string::npos)
                ext = &path.c_str()[dot + 1];
            if (ext && *ext) {
                for (const auto& se : storeExts) {
                    if (strcmp(se.c_str(), ext) == 0) {
                        pf = UNCOMPRESSED;
                        break;
                    }
                }
            }
        }

        if (dirName.aliasTo.length()) {
            target = dirName.aliasTo + target;
        }
        for (auto& t : target)
            if (t == '\\')
                t = '/';
        strLen += target.length();

        fileNames.emplace_back(path, target, pf);
    });
}